

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.h
# Opt level: O0

tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*> * __thiscall
slang::parsing::ParserBase::
parseGroupOrSkip<slang::parsing::Parser::parseParamValue()::__0,slang::syntax::ExpressionSyntax*>
          (ParserBase *this,TokenKind startKind,TokenKind endKind,anon_class_8_1_8991fb9c *parseItem
          )

{
  bool bVar1;
  TokenKind in_CX;
  SourceLocation in_RDI;
  ParserBase *in_R8;
  Token TVar2;
  Token end;
  ExpressionSyntax *result;
  Token start;
  tuple<slang::parsing::Token,_slang::parsing::Token,_std::nullptr_t> *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff56;
  SourceLocation location;
  Token in_stack_ffffffffffffffd0;
  TokenKind kind;
  
  location = in_RDI;
  TVar2 = expect(in_R8,in_stack_ffffffffffffffd0.info._6_2_);
  kind = TVar2.info._6_2_;
  bVar1 = Token::isMissing((Token *)&stack0xffffffffffffffd0);
  if (bVar1) {
    Token::location((Token *)&stack0xffffffffffffffd0);
    missingToken((ParserBase *)in_RDI,in_CX,location);
    std::make_tuple<slang::parsing::Token&,slang::parsing::Token,decltype(nullptr)>
              ((Token *)in_RDI,(Token *)CONCAT26(in_CX,in_stack_ffffffffffffff50),
               (void **)in_stack_ffffffffffffff48);
    std::tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*>::
    tuple<slang::parsing::Token,_slang::parsing::Token,_std::nullptr_t,_true,_true>
              ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*>
                *)CONCAT26(in_CX,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  }
  else {
    bVar1 = peek((ParserBase *)location,in_RDI._6_2_);
    if (!bVar1) {
      Parser::parseParamValue::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)
                 CONCAT26(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50));
    }
    expect(in_R8,kind);
    std::make_tuple<slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&>
              ((Token *)in_RDI,
               (Token *)CONCAT26(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50),
               (ExpressionSyntax **)in_stack_ffffffffffffff48);
  }
  return (tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::ExpressionSyntax_*> *)
         location;
}

Assistant:

std::tuple<Token, Token, TResult> parseGroupOrSkip(TokenKind startKind, TokenKind endKind,
                                                       TParserFunc&& parseItem) {
        Token start = expect(startKind);
        if (start.isMissing())
            return std::make_tuple(start, missingToken(endKind, start.location()), nullptr);

        TResult result = nullptr;
        if (!peek(endKind))
            result = parseItem();

        Token end = expect(endKind);
        return std::make_tuple(start, end, result);
    }